

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

void kmp_create_affinity_mask_(void **mask)

{
  void *pvVar1;
  ulong uVar2;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  pvVar1 = kmpc_malloc(__kmp_affin_mask_size);
  *mask = pvVar1;
  if (__kmp_affin_mask_size != 0) {
    uVar2 = 0;
    do {
      *(undefined1 *)((long)*mask + uVar2) = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < __kmp_affin_mask_size);
  }
  return;
}

Assistant:

void FTN_STDCALL
FTN_CREATE_AFFINITY_MASK( void **mask )
{
    #if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
        *mask = NULL;
    #else
        //
        // We really only NEED serial initialization here.
        //
        if ( ! TCR_4(__kmp_init_middle) ) {
            __kmp_middle_initialize();
        }
    # if KMP_USE_HWLOC
        *mask = (hwloc_cpuset_t)hwloc_bitmap_alloc();
    # else
        *mask = kmpc_malloc( __kmp_affin_mask_size );
    # endif
        KMP_CPU_ZERO( (kmp_affin_mask_t *)(*mask) );
    #endif
}